

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O0

void __thiscall Dinic_MultipleEdges_Test::TestBody(Dinic_MultipleEdges_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  Flow local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  undefined1 local_80 [8];
  Dinic d;
  Dinic_MultipleEdges_Test *this_local;
  
  d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  Dinic::Dinic((Dinic *)local_80,2);
  Dinic::addEdge((Dinic *)local_80,0,1,100);
  Dinic::addEdge((Dinic *)local_80,0,1,0x17);
  local_a8 = Dinic::getFlow((Dinic *)local_80,0,1);
  local_ac = 0x7b;
  testing::internal::EqHelper<false>::Compare<long_long,int>
            ((EqHelper<false> *)local_a0,"d.getFlow(0, 1)","123",&local_a8,&local_ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/dinic_test.cpp"
               ,0x1c,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  Dinic::~Dinic((Dinic *)local_80);
  return;
}

Assistant:

TEST(Dinic, MultipleEdges) {
    Dinic d(2);
    d.addEdge(0, 1, 100);
    d.addEdge(0, 1, 23);
    EXPECT_EQ(d.getFlow(0, 1), 123);
}